

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O0

FT_Error T1_Set_Var_Design(T1_Face face,FT_UInt num_coords,FT_Fixed *coords)

{
  FT_Error FVar1;
  FT_Fixed FVar2;
  uint local_4c;
  FT_UInt i;
  FT_Long lcoords [4];
  FT_Fixed *coords_local;
  FT_UInt num_coords_local;
  T1_Face face_local;
  
  coords_local._4_4_ = num_coords;
  if (4 < num_coords) {
    coords_local._4_4_ = 4;
  }
  for (local_4c = 0; local_4c < coords_local._4_4_; local_4c = local_4c + 1) {
    FVar2 = FT_RoundFix(coords[local_4c]);
    *(FT_Fixed *)(&stack0xffffffffffffffb8 + (ulong)local_4c * 8) = FVar2 >> 0x10;
  }
  FVar1 = T1_Set_MM_Design(face,coords_local._4_4_,(FT_Long *)&stack0xffffffffffffffb8);
  return FVar1;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T1_Set_Var_Design( T1_Face    face,
                     FT_UInt    num_coords,
                     FT_Fixed*  coords )
  {
     FT_Long  lcoords[T1_MAX_MM_AXIS];
     FT_UInt  i;


     if ( num_coords > T1_MAX_MM_AXIS )
       num_coords = T1_MAX_MM_AXIS;

     for ( i = 0; i < num_coords; i++ )
       lcoords[i] = FIXED_TO_INT( coords[i] );

     return T1_Set_MM_Design( face, num_coords, lcoords );
  }